

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
               (IntegerDecimalCastData<short> *state)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  result_t tmp;
  
  uVar3 = state->result;
  tmp = (result_t)uVar3;
  if ((long)tmp == uVar3) {
    uVar2 = state->decimal;
    iVar4 = *(int *)&state->decimal_digits;
    while( true ) {
      iVar4 = iVar4 + -1;
      if ((long)uVar2 < 0xb) break;
      uVar2 = uVar2 / 10;
      state->decimal = uVar2;
      state->decimal_digits = (uint16_t)iVar4;
    }
    bVar1 = true;
    if (4 < (long)uVar2 && (uint16_t)iVar4 == 0) {
      bVar1 = TrySubtractOperator::Operation<short,short,short>(tmp,1,&tmp);
      uVar3 = (ulong)(ushort)tmp;
    }
    state->result = (long)(short)uVar3;
    return bVar1;
  }
  return false;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		using store_t = typename T::StoreType;

		result_t tmp;
		if (!TryCast::Operation<store_t, result_t>(state.result, tmp)) {
			return false;
		}

		while (state.decimal > 10) {
			state.decimal /= 10;
			state.decimal_digits--;
		}

		bool success = true;
		if (state.decimal_digits == 1 && state.decimal >= 5) {
			if (NEGATIVE) {
				success = TrySubtractOperator::Operation(tmp, (result_t)1, tmp);
			} else {
				success = TryAddOperator::Operation(tmp, (result_t)1, tmp);
			}
		}
		state.result = tmp;
		return success;
	}